

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

void __thiscall ON_CurvePipingUserData::SetToDefaults(ON_CurvePipingUserData *this)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  ON_XMLNode *pOVar4;
  double dValue;
  ON_XMLVariant local_678;
  ON_XMLVariant local_580;
  ON_XMLVariant local_488;
  ON_XMLVariant local_390;
  ON_XMLVariant local_298;
  ON_XMLVariant local_1a0;
  undefined1 local_a8 [8];
  ON_XMLParameters p;
  Defaults d;
  ON_XMLNode *root;
  ON_XMLProperty prop;
  ON_CurvePipingUserData *ud;
  ON_CurvePipingUserData *this_local;
  
  prop._PRIVATE._80_8_ = this;
  (*(this->super_ON_XMLUserData).super_ON_UserData.super_ON_Object._vptr_ON_Object[0x24])();
  ON_XMLProperty::ON_XMLProperty((ON_XMLProperty *)&root);
  plVar3 = (long *)(**(code **)(*(long *)prop._PRIVATE._80_8_ + 0xf8))();
  pOVar4 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar4,L"curve-piping-object-data");
  pOVar4 = (ON_XMLNode *)(**(code **)(*plVar3 + 0x58))(plVar3,pOVar4);
  ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)local_a8,pOVar4);
  ::ON_XMLVariant::ON_XMLVariant(&local_1a0,false);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"on",&local_1a0);
  ::ON_XMLVariant::~ON_XMLVariant(&local_1a0);
  dValue = ON_CurvePiping::Defaults::Radius();
  ::ON_XMLVariant::ON_XMLVariant(&local_298,dValue);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"radius",&local_298);
  ::ON_XMLVariant::~ON_XMLVariant(&local_298);
  iVar2 = ON_CurvePiping::Defaults::Segments();
  ::ON_XMLVariant::ON_XMLVariant(&local_390,iVar2);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"segments",&local_390);
  ::ON_XMLVariant::~ON_XMLVariant(&local_390);
  iVar2 = ON_CurvePiping::Defaults::Accuracy();
  ::ON_XMLVariant::ON_XMLVariant(&local_488,iVar2);
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"accuracy",&local_488);
  ::ON_XMLVariant::~ON_XMLVariant(&local_488);
  bVar1 = ON_CurvePiping::Defaults::Faceted();
  ::ON_XMLVariant::ON_XMLVariant(&local_580,(bool)(~bVar1 & 1));
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"weld",&local_580);
  ::ON_XMLVariant::~ON_XMLVariant(&local_580);
  ::ON_XMLVariant::ON_XMLVariant(&local_678,L"dome");
  ON_XMLParameters::SetParam((ON_XMLParameters *)local_a8,L"cap-type",&local_678);
  ::ON_XMLVariant::~ON_XMLVariant(&local_678);
  ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)local_a8);
  ON_XMLProperty::~ON_XMLProperty((ON_XMLProperty *)&root);
  return;
}

Assistant:

void ON_CurvePipingUserData::SetToDefaults(void) const
{
  auto& ud = const_cast<ON_CurvePipingUserData&>(*this);
  ud.Clear();

  ON_XMLProperty prop;
  ON_XMLNode* root = ud.XMLRootForWrite().AttachChildNode(new ON_XMLNode(ON_CURVE_PIPING_ROOT));

  ON_CurvePiping::Defaults d;

  ON_XMLParameters p(*root);
  p.SetParam(ON_CURVE_PIPING_ON, false);
  p.SetParam(ON_CURVE_PIPING_RADIUS, d.Radius());
  p.SetParam(ON_CURVE_PIPING_SEGMENTS, d.Segments());
  p.SetParam(ON_CURVE_PIPING_ACCURACY, d.Accuracy());
  p.SetParam(ON_CURVE_PIPING_WELD, !d.Faceted()); // 'Weld' is the inverse of 'Faceted'.
  p.SetParam(ON_CURVE_PIPING_CAP_TYPE, L"dome");
}